

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.h
# Opt level: O0

void __thiscall slang::ast::ScriptSession::~ScriptSession(ScriptSession *this)

{
  Compilation *in_RDI;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *unaff_retaddr;
  
  EvalContext::~EvalContext((EvalContext *)in_RDI);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::~vector(unaff_retaddr);
  Compilation::~Compilation(in_RDI);
  Bag::~Bag((Bag *)0x3807c8);
  return;
}

Assistant:

class SLANG_EXPORT ScriptSession {
public:
    /// A bag of options to apply to the various evaluated snippets.
    Bag options;

    /// A compilation object that holds state across evaluation calls.
    Compilation compilation;

    /// A compilation unit that acts as a scope for evaluation.
    CompilationUnitSymbol& scope;

    /// Constructs a new ScriptSession.
    explicit ScriptSession(Bag options = {});

    /// Tries to evaluate the given snippet of SystemVerilog code
    /// and returns the result as a constant value.
    ConstantValue eval(std::string_view text);

    /// Tries to evaluate the given expression tree and returns the
    /// result as a constant value.
    ConstantValue evalExpression(const syntax::ExpressionSyntax& expr);

    /// Tries to evaluate the given statement tree and returns the
    /// result as a constant value.
    void evalStatement(const syntax::StatementSyntax& expr);

    /// Gets any diagnostics that have been issued during evaluation calls.
    Diagnostics getDiagnostics();

private:
    std::vector<std::shared_ptr<syntax::SyntaxTree>> syntaxTrees;
    ASTContext astCtx;
    EvalContext evalContext;
}